

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_meta_test.c
# Opt level: O0

void * meta_test(void *param)

{
  uint uVar1;
  int local_60;
  undefined1 local_5c [4];
  RK_S32 i;
  RK_S32 val;
  void *ptr;
  MppBuffer buffer;
  MppPacket packet;
  MppFrame frame;
  long lStack_30;
  MPP_RET ret;
  MppMeta meta;
  RK_S64 time_end;
  RK_S64 time_start;
  long *plStack_10;
  RK_S32 loop_max;
  void *param_local;
  
  time_start._4_4_ = 100000;
  lStack_30 = 0;
  frame._4_4_ = 0;
  plStack_10 = (long *)param;
  time_end = mpp_time();
  local_60 = 0;
  while( true ) {
    if (time_start._4_4_ <= local_60) {
      meta = (MppMeta)mpp_time();
      if (frame._4_4_ != 0) {
        _mpp_log_l(4,"mpp_meta_test","meta setting and getting, ret %d\n",0,frame._4_4_);
      }
      *plStack_10 = ((long)meta - time_end) / (long)time_start._4_4_;
      return (void *)0x0;
    }
    uVar1 = mpp_meta_get_with_tag(&stack0xffffffffffffffd0,"mpp_meta_test","meta_test");
    frame._4_4_ = uVar1 | frame._4_4_;
    if ((lStack_30 == 0) &&
       (_mpp_log_l(2,"mpp_meta_test","Assertion %s failed at %s:%d\n",0,"meta","meta_test",0x2e),
       (_mpp_debug & 0x10000000) != 0)) break;
    uVar1 = mpp_meta_set_frame(lStack_30,0x6966726d,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_packet(lStack_30,0x69706b74,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_frame(lStack_30,0x6f66726d,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_packet(lStack_30,0x6f706b74,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_buffer(lStack_30,0x6d766966,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_buffer(lStack_30,0x68647220,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_s32(lStack_30,0x69626c6b,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_s32(lStack_30,0x6f626c6b,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_s32(lStack_30,0x69696472,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_s32(lStack_30,0x6f696472,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_s32(lStack_30,0x746c6964,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_s32(lStack_30,0x6c746964,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_s32(lStack_30,0x61766771,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_ptr(lStack_30,0x726f6920,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_ptr(lStack_30,0x6f736420,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_ptr(lStack_30,0x6f736432,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_ptr(lStack_30,0x75737264,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_ptr(lStack_30,0x75726473,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_buffer(lStack_30,0x65716d30,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_ptr(lStack_30,0x6d766c74,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_s32(lStack_30,0x6d6c7472,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_s32(lStack_30,0x756c7472,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_s32(lStack_30,0x66726d71,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_set_s32(lStack_30,0x62706964,0);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_frame(lStack_30,0x6966726d,&packet);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_packet(lStack_30,0x69706b74,&buffer);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_frame(lStack_30,0x6f66726d,&packet);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_packet(lStack_30,0x6f706b74,&buffer);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_buffer(lStack_30,0x6d766966,&ptr);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_buffer(lStack_30,0x68647220,&ptr);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_s32(lStack_30,0x69626c6b,local_5c);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_s32(lStack_30,0x6f626c6b,local_5c);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_s32(lStack_30,0x69696472,local_5c);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_s32(lStack_30,0x6f696472,local_5c);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_s32(lStack_30,0x746c6964,local_5c);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_s32(lStack_30,0x6c746964,local_5c);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_s32(lStack_30,0x61766771,local_5c);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_ptr(lStack_30,0x726f6920,&i);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_ptr(lStack_30,0x6f736420,&i);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_ptr(lStack_30,0x6f736432,&i);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_ptr(lStack_30,0x75737264,&i);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_ptr(lStack_30,0x75726473,&i);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_buffer(lStack_30,0x65716d30,&ptr);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_ptr(lStack_30,0x6d766c74,&i);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_s32(lStack_30,0x6d6c7472,local_5c);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_s32(lStack_30,0x756c7472,local_5c);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_s32(lStack_30,0x66726d71,local_5c);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_get_s32(lStack_30,0x62706964,local_5c);
    frame._4_4_ = uVar1 | frame._4_4_;
    uVar1 = mpp_meta_put(lStack_30);
    frame._4_4_ = uVar1 | frame._4_4_;
    local_60 = local_60 + 1;
  }
  abort();
}

Assistant:

void *meta_test(void *param)
{
    RK_S32 loop_max = LOOP_MAX;
    RK_S64 time_start;
    RK_S64 time_end;
    MppMeta meta = NULL;
    MPP_RET ret = MPP_OK;
    MppFrame frame;
    MppPacket packet;
    MppBuffer buffer;
    void *ptr;
    RK_S32 val;
    RK_S32 i;

    time_start = mpp_time();

    for (i = 0; i < loop_max; i++) {
        ret |= mpp_meta_get(&meta);
        mpp_assert(meta);

        /* set */
        ret |= mpp_meta_set_frame(meta,  KEY_INPUT_FRAME, NULL);
        ret |= mpp_meta_set_packet(meta, KEY_INPUT_PACKET, NULL);
        ret |= mpp_meta_set_frame(meta,  KEY_OUTPUT_FRAME, NULL);
        ret |= mpp_meta_set_packet(meta, KEY_OUTPUT_PACKET, NULL);

        ret |= mpp_meta_set_buffer(meta, KEY_MOTION_INFO, NULL);
        ret |= mpp_meta_set_buffer(meta, KEY_HDR_INFO, NULL);

        ret |= mpp_meta_set_s32(meta, KEY_INPUT_BLOCK, 0);
        ret |= mpp_meta_set_s32(meta, KEY_OUTPUT_BLOCK, 0);
        ret |= mpp_meta_set_s32(meta, KEY_INPUT_IDR_REQ, 0);
        ret |= mpp_meta_set_s32(meta, KEY_OUTPUT_INTRA, 0);

        ret |= mpp_meta_set_s32(meta, KEY_TEMPORAL_ID, 0);
        ret |= mpp_meta_set_s32(meta, KEY_LONG_REF_IDX, 0);
        ret |= mpp_meta_set_s32(meta, KEY_ENC_AVERAGE_QP, 0);

        ret |= mpp_meta_set_ptr(meta, KEY_ROI_DATA, NULL);
        ret |= mpp_meta_set_ptr(meta, KEY_OSD_DATA, NULL);
        ret |= mpp_meta_set_ptr(meta, KEY_OSD_DATA2, NULL);
        ret |= mpp_meta_set_ptr(meta, KEY_USER_DATA, NULL);
        ret |= mpp_meta_set_ptr(meta, KEY_USER_DATAS, NULL);

        ret |= mpp_meta_set_buffer(meta, KEY_QPMAP0, NULL);
        ret |= mpp_meta_set_ptr(meta, KEY_MV_LIST, NULL);

        ret |= mpp_meta_set_s32(meta, KEY_ENC_MARK_LTR, 0);
        ret |= mpp_meta_set_s32(meta, KEY_ENC_USE_LTR, 0);
        ret |= mpp_meta_set_s32(meta, KEY_ENC_FRAME_QP, 0);
        ret |= mpp_meta_set_s32(meta, KEY_ENC_BASE_LAYER_PID, 0);

        /* get */
        ret |= mpp_meta_get_frame(meta,  KEY_INPUT_FRAME, &frame);
        ret |= mpp_meta_get_packet(meta, KEY_INPUT_PACKET, &packet);
        ret |= mpp_meta_get_frame(meta,  KEY_OUTPUT_FRAME, &frame);
        ret |= mpp_meta_get_packet(meta, KEY_OUTPUT_PACKET, &packet);

        ret |= mpp_meta_get_buffer(meta, KEY_MOTION_INFO, &buffer);
        ret |= mpp_meta_get_buffer(meta, KEY_HDR_INFO, &buffer);

        ret |= mpp_meta_get_s32(meta, KEY_INPUT_BLOCK, &val);
        ret |= mpp_meta_get_s32(meta, KEY_OUTPUT_BLOCK, &val);
        ret |= mpp_meta_get_s32(meta, KEY_INPUT_IDR_REQ, &val);
        ret |= mpp_meta_get_s32(meta, KEY_OUTPUT_INTRA, &val);

        ret |= mpp_meta_get_s32(meta, KEY_TEMPORAL_ID, &val);
        ret |= mpp_meta_get_s32(meta, KEY_LONG_REF_IDX, &val);
        ret |= mpp_meta_get_s32(meta, KEY_ENC_AVERAGE_QP, &val);

        ret |= mpp_meta_get_ptr(meta, KEY_ROI_DATA, &ptr);
        ret |= mpp_meta_get_ptr(meta, KEY_OSD_DATA, &ptr);
        ret |= mpp_meta_get_ptr(meta, KEY_OSD_DATA2, &ptr);
        ret |= mpp_meta_get_ptr(meta, KEY_USER_DATA, &ptr);
        ret |= mpp_meta_get_ptr(meta, KEY_USER_DATAS, &ptr);

        ret |= mpp_meta_get_buffer(meta, KEY_QPMAP0, &buffer);
        ret |= mpp_meta_get_ptr(meta, KEY_MV_LIST, &ptr);

        ret |= mpp_meta_get_s32(meta, KEY_ENC_MARK_LTR, &val);
        ret |= mpp_meta_get_s32(meta, KEY_ENC_USE_LTR, &val);
        ret |= mpp_meta_get_s32(meta, KEY_ENC_FRAME_QP, &val);
        ret |= mpp_meta_get_s32(meta, KEY_ENC_BASE_LAYER_PID, &val);

        ret |= mpp_meta_put(meta);
    }

    time_end = mpp_time();

    if (ret)
        mpp_log("meta setting and getting, ret %d\n", ret);

    *((RK_S64 *)param) = (time_end - time_start) / loop_max;

    return NULL;
}